

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall cmFileCopier::Install(cmFileCopier *this,string *fromFile,string *toFile)

{
  pointer pcVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  MatchProperties match_properties;
  string newFromFile;
  string newToFile;
  string local_70;
  string local_50;
  
  if (fromFile->_M_string_length == 0) {
    pcVar2 = this->Status;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"INSTALL encountered an empty string input file name.","");
    std::__cxx11::string::_M_assign((string *)&pcVar2->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    uVar4 = 0;
  }
  else {
    match_properties = CollectMatchProperties(this,fromFile);
    uVar4 = 1;
    if ((((ulong)match_properties & 1) == 0) &&
       (bVar3 = cmsys::SystemTools::SameFile(fromFile,toFile), !bVar3)) {
      pcVar1 = (fromFile->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + fromFile->_M_string_length);
      pcVar1 = (toFile->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + toFile->_M_string_length);
      if ((this->FollowSymlinkChain != true) ||
         (bVar3 = InstallSymlinkChain(this,&local_70,&local_50), bVar3)) {
        bVar3 = cmsys::SystemTools::FileIsSymlink(&local_70);
        if (bVar3) {
          uVar4 = InstallSymlink(this,&local_70,&local_50);
        }
        else {
          bVar3 = cmsys::SystemTools::FileIsDirectory(&local_70);
          if (bVar3) {
            uVar4 = InstallDirectory(this,&local_70,&local_50,match_properties);
          }
          else {
            bVar3 = cmsys::SystemTools::FileExists(&local_70);
            if (bVar3) {
              iVar5 = (*this->_vptr_cmFileCopier[2])(this,&local_70,&local_50,match_properties);
              uVar4 = (undefined1)iVar5;
            }
            else {
              iVar5 = (*this->_vptr_cmFileCopier[6])(this,&local_70);
              uVar4 = (undefined1)iVar5;
            }
          }
        }
      }
      else {
        uVar4 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return (bool)uVar4;
}

Assistant:

bool cmFileCopier::Install(const std::string& fromFile,
                           const std::string& toFile)
{
  if (fromFile.empty()) {
    this->Status.SetError(
      "INSTALL encountered an empty string input file name.");
    return false;
  }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if (match_properties.Exclude) {
    return true;
  }

  if (cmSystemTools::SameFile(fromFile, toFile)) {
    return true;
  }

  std::string newFromFile = fromFile;
  std::string newToFile = toFile;

  if (this->FollowSymlinkChain &&
      !this->InstallSymlinkChain(newFromFile, newToFile)) {
    return false;
  }

  if (cmSystemTools::FileIsSymlink(newFromFile)) {
    return this->InstallSymlink(newFromFile, newToFile);
  }
  if (cmSystemTools::FileIsDirectory(newFromFile)) {
    return this->InstallDirectory(newFromFile, newToFile, match_properties);
  }
  if (cmSystemTools::FileExists(newFromFile)) {
    return this->InstallFile(newFromFile, newToFile, match_properties);
  }
  return this->ReportMissing(newFromFile);
}